

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

int CVmObjBigNum::radix_from_string(char *str,size_t len)

{
  int iVar1;
  wchar_t wVar2;
  size_t *in_RSI;
  bool bVar3;
  size_t rem;
  utf8_ptr p;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  utf8_ptr *in_stack_ffffffffffffffe0;
  int local_4;
  
  utf8_ptr::utf8_ptr((utf8_ptr *)
                     CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                                      )),in_stack_ffffffffffffffc8);
  while( true ) {
    bVar3 = false;
    if (in_RSI != (size_t *)0x0) {
      utf8_ptr::getch((utf8_ptr *)0x2bef1f);
      iVar1 = is_space(L'\0');
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    utf8_ptr::inc(in_stack_ffffffffffffffe0,in_RSI);
  }
  if ((in_RSI != (size_t *)0x0) &&
     ((wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bef5f), wVar2 == L'-' ||
      (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bef6e), wVar2 == L'+')))) {
    utf8_ptr::inc(in_stack_ffffffffffffffe0,in_RSI);
  }
  while( true ) {
    bVar3 = false;
    if (in_RSI != (size_t *)0x0) {
      utf8_ptr::getch((utf8_ptr *)0x2bef9c);
      iVar1 = is_space(L'\0');
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    utf8_ptr::inc(in_stack_ffffffffffffffe0,in_RSI);
  }
  if ((in_RSI == (size_t *)0x0) || (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2befe0), wVar2 != L'0')) {
    local_4 = 10;
  }
  else {
    utf8_ptr::inc(in_stack_ffffffffffffffe0,in_RSI);
    if ((in_RSI == (size_t *)0x0) ||
       ((wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bf00a), wVar2 != L'x' &&
        (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bf019), wVar2 != L'X')))) {
      while (in_RSI != (size_t *)0x0) {
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bf03f);
        if (wVar2 == L'.') {
          return 10;
        }
        if (7 < (uint)(wVar2 + L'\xffffffd0')) {
          if ((uint)(wVar2 + L'\xffffffc8') < 2) {
            return 10;
          }
          if (wVar2 == L'E') {
            return 10;
          }
          if (wVar2 == L'e') {
            return 10;
          }
          return 8;
        }
        utf8_ptr::inc(in_stack_ffffffffffffffe0,in_RSI);
      }
      local_4 = 8;
    }
    else {
      local_4 = 0x10;
    }
  }
  return local_4;
}

Assistant:

int CVmObjBigNum::radix_from_string(const char *str, size_t len)
{
    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a radix indicator */
    if (rem != 0 && p.getch() == '0')
    {
        /*
         *   There's a leading zero, so it could be hex or octal.  If there's
         *   an 'x', it's definitely hex.  Otherwise, it's octal as long as
         *   it's in purely integer format - that is, no decimal point or 'E'
         *   exponent marker.
         */
        p.inc(&rem);
        if (rem != 0 && (p.getch() == 'x' || p.getch() == 'X'))
        {
            /* 0x prefix, so it's definitely hex */
            return 16;
        }

        /* 
         *   There's a leading 0 but no 'x', so it could be octal or decimal,
         *   depending on what's in the rest of the string. 
         */
        for ( ; rem != 0 ; p.inc(&rem))
        {
            switch (p.getch())
            {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
                /* octal digit, so we can't rule anything out yet */
                continue;

            case '.':
            case 'e':
            case 'E':
                /* 
                 *   decimal point or exponent marker, so it's a floating
                 *   point value, which can only be decimal 
                 */
                return 10;
                
            case '8':
            case '9':
                /* an 8 or a 9 can only appear in a decimal number */
                return 10;

            default:
                /* 
                 *   Anything else is invalid within a number, whether octal
                 *   integer or floating point, so we've reached the end of
                 *   the number.  Since we didn't encounter anything that
                 *   makes the number a floating point value or decimal
                 *   integer, we have an octal integer.
                 */
                return 8;
            }
        }

        /* 
         *   we reached the end of the number without finding anything that
         *   would rule out treating it as an octal integer, so that's what
         *   it is 
         */
        return 8;
    }
    else
    {
        /* no leading '0', so it's decimal */
        return 10;
    }
}